

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_unhash.cpp
# Opt level: O3

void __thiscall ritobin::BinUnhasher::unhash_bin(BinUnhasher *this,Bin *bin,int max_depth)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (bin->sections)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    unhash_value(this,(Value *)(p_Var1 + 5),max_depth);
  }
  return;
}

Assistant:

void BinUnhasher::unhash_bin(Bin& bin, int max_depth) const noexcept {
        for (auto& [key, value] : bin.sections) {
            unhash_value(value, max_depth);
        }
    }